

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

uint capnp::(anonymous_namespace)::checkRoundTripFromFloat<unsigned_int,double>(double value)

{
  bool bVar1;
  Fault local_f8;
  Fault f_2;
  DebugExpression<double> local_e8;
  undefined1 local_e0 [8];
  DebugComparison<double,_double_&> _kjCondition_2;
  uint result;
  Fault f_1;
  double *local_a0;
  undefined1 local_98 [8];
  DebugComparison<double_&,_double> _kjCondition_1;
  Fault local_60;
  Fault f;
  double *local_50;
  undefined1 local_48 [8];
  DebugComparison<double_&,_double> _kjCondition;
  uint MAX;
  uint MIN;
  double value_local;
  
  _kjCondition._36_4_ = 0;
  _kjCondition.result = true;
  _kjCondition._33_3_ = 0xffffff;
  _MAX = value;
  local_50 = (double *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&MAX);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<double&>::operator>=
            ((DebugComparison<double_&,_double> *)local_48,(DebugExpression<double&> *)&local_50,
             (double *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    local_a0 = (double *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&MAX);
    f_1.exception = (Exception *)0x41efffffffe00000;
    kj::_::DebugExpression<double&>::operator<=
              ((DebugComparison<double_&,_double> *)local_98,(DebugExpression<double&> *)&local_a0,
               (double *)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (bVar1) {
      _kjCondition_2._36_4_ = SUB84((long)_MAX,0);
      f_2.exception = (Exception *)(double)((long)_MAX & 0xffffffff);
      local_e8 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&f_2);
      kj::_::DebugExpression<double>::operator==
                ((DebugComparison<double,_double_&> *)local_e0,&local_e8,(double *)&MAX);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<double,double&>&,char_const(&)[39],double&>
                  (&local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x6df,FAILED,"U(result) == value",
                   "_kjCondition,\"Value out-of-range for requested type.\", value",
                   (DebugComparison<double,_double_&> *)local_e0,
                   (char (*) [39])"Value out-of-range for requested type.",(double *)&MAX);
        kj::_::Debug::Fault::~Fault(&local_f8);
      }
      value_local._4_4_ = _kjCondition_2._36_4_;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
                ((Fault *)&stack0xffffffffffffff50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x6db,FAILED,"value <= U(MAX)",
                 "_kjCondition,\"Value out-of-range for requested type.\", value",
                 (DebugComparison<double_&,_double> *)local_98,
                 (char (*) [39])"Value out-of-range for requested type.",(double *)&MAX);
      value_local._4_4_ = 0xffffffff;
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff50);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6d8,FAILED,"value >= U(MIN)",
               "_kjCondition,\"Value out-of-range for requested type.\", value",
               (DebugComparison<double_&,_double> *)local_48,
               (char (*) [39])"Value out-of-range for requested type.",(double *)&MAX);
    value_local._4_4_ = 0;
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  return value_local._4_4_;
}

Assistant:

T checkRoundTripFromFloat(U value) {
  // When `U` is `float` or `double`, we have to use a different approach, because casting an
  // out-of-range float to an integer is, surprisingly, UB.
  constexpr T MIN = kj::minValue;
  constexpr T MAX = kj::maxValue;
  KJ_REQUIRE(value >= U(MIN), "Value out-of-range for requested type.", value) {
    return MIN;
  }
  KJ_REQUIRE(value <= U(MAX), "Value out-of-range for requested type.", value) {
    return MAX;
  }
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}